

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessor.cpp
# Opt level: O0

bool __thiscall
solitaire::events::EventsProcessor::checkIfCollidesAndTryPullOutOrUncoverCardsFromTableauPile
          (EventsProcessor *this,PileId *id,MouseLeftButtonDown *event)

{
  Context *pCVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  uint *puVar4;
  PileId local_40;
  _Optional_payload_base<unsigned_int> local_3c;
  optional<unsigned_int> cardIndex;
  TableauPileCollider *collider;
  MouseLeftButtonDown *event_local;
  PileId *id_local;
  EventsProcessor *this_local;
  
  pCVar1 = this->context;
  piles::PileId::PileId((PileId *)&cardIndex,id);
  iVar3 = (*pCVar1->_vptr_Context[8])(pCVar1,&cardIndex);
  register0x00000000 = (long *)CONCAT44(extraout_var,iVar3);
  local_3c = (_Optional_payload_base<unsigned_int>)
             (**(code **)(*register0x00000000 + 0x10))(register0x00000000,event);
  bVar2 = std::optional::operator_cast_to_bool((optional *)&local_3c);
  if (bVar2) {
    piles::PileId::PileId(&local_40,id);
    puVar4 = std::optional<unsigned_int>::value((optional<unsigned_int> *)&local_3c);
    tryPullOutOrUncoverCardsFromTableauPile(this,&local_40,event,*puVar4);
  }
  return bVar2;
}

Assistant:

bool EventsProcessor::checkIfCollidesAndTryPullOutOrUncoverCardsFromTableauPile(
    const PileId id, const MouseLeftButtonDown& event) const
{
    const auto& collider = context.getTableauPileCollider(id);
    const auto cardIndex = collider.tryGetCollidedCardIndex(event.position);
    if (cardIndex) {
        tryPullOutOrUncoverCardsFromTableauPile(id, event, cardIndex.value());
        return true;
    }
    return false;
}